

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

pair<cmFileSet_*,_bool> __thiscall
cmTarget::GetOrCreateFileSet(cmTarget *this,string *name,string *type,cmFileSetVisibility vis)

{
  undefined4 uVar1;
  bool bVar2;
  pointer pcVar3;
  pointer ppVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>,_bool>
  pVar5;
  pair<cmFileSet_*,_bool> pVar6;
  cmFileSet *local_260;
  cmListFileBacktrace local_258;
  size_t local_248;
  char *local_240;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_238;
  cmListFileBacktrace local_228;
  size_t local_218;
  char *local_210;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_208;
  cmListFileBacktrace local_1f8;
  size_t local_1e8;
  char *local_1e0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1d8;
  undefined1 local_1c8 [8];
  cmListFileBacktrace bt;
  string local_198;
  string local_178;
  cmFileSet local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>
  local_e0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>
  local_48;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>,_bool>
  result;
  cmFileSetVisibility vis_local;
  string *type_local;
  string *name_local;
  cmTarget *this_local;
  
  result._12_4_ = vis;
  pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  std::__cxx11::string::string((string *)&local_178,(string *)name);
  std::__cxx11::string::string((string *)&local_198,(string *)type);
  cmFileSet::cmFileSet(&local_158,&local_178,&local_198,result._12_4_);
  std::make_pair<std::__cxx11::string_const&,cmFileSet>(&local_e0,name,&local_158);
  pVar5 = std::
          map<std::__cxx11::string,cmFileSet,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFileSet>>>
          ::emplace<std::pair<std::__cxx11::string,cmFileSet>>
                    ((map<std::__cxx11::string,cmFileSet,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFileSet>>>
                      *)&pcVar3->FileSets,&local_e0);
  bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar5.first._M_node;
  result.first._M_node._0_1_ = pVar5.second;
  local_48._M_node =
       (_Base_ptr)
       bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>::
  ~pair(&local_e0);
  cmFileSet::~cmFileSet(&local_158);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  if (((byte)result.first._M_node & 1) != 0) {
    std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
              (&this->impl);
    cmMakefile::GetBacktrace((cmMakefile *)local_1c8);
    local_1d8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)type);
    pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                       (&this->impl);
    local_1e8 = (pcVar3->HeadersFileSets).TypeName.super_string_view._M_len;
    local_1e0 = (pcVar3->HeadersFileSets).TypeName.super_string_view._M_str;
    bVar2 = std::operator==(local_1d8,(pcVar3->HeadersFileSets).TypeName.super_string_view);
    if (bVar2) {
      pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      uVar1 = result._12_4_;
      cmListFileBacktrace::cmListFileBacktrace(&local_1f8,(cmListFileBacktrace *)local_1c8);
      anon_unknown.dwarf_104bbf5::FileSetType::AddFileSet
                (&pcVar3->HeadersFileSets,name,uVar1,&local_1f8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1f8);
    }
    else {
      local_208 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)type);
      pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      local_218 = (pcVar3->CxxModulesFileSets).TypeName.super_string_view._M_len;
      local_210 = (pcVar3->CxxModulesFileSets).TypeName.super_string_view._M_str;
      bVar2 = std::operator==(local_208,(pcVar3->CxxModulesFileSets).TypeName.super_string_view);
      if (bVar2) {
        pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        uVar1 = result._12_4_;
        cmListFileBacktrace::cmListFileBacktrace(&local_228,(cmListFileBacktrace *)local_1c8);
        anon_unknown.dwarf_104bbf5::FileSetType::AddFileSet
                  (&pcVar3->CxxModulesFileSets,name,uVar1,&local_228);
        cmListFileBacktrace::~cmListFileBacktrace(&local_228);
      }
      else {
        local_238 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)type);
        pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        local_248 = (pcVar3->CxxModuleHeadersFileSets).TypeName.super_string_view._M_len;
        local_240 = (pcVar3->CxxModuleHeadersFileSets).TypeName.super_string_view._M_str;
        bVar2 = std::operator==(local_238,
                                (pcVar3->CxxModuleHeadersFileSets).TypeName.super_string_view);
        if (bVar2) {
          pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                   operator->(&this->impl);
          uVar1 = result._12_4_;
          cmListFileBacktrace::cmListFileBacktrace(&local_258,(cmListFileBacktrace *)local_1c8);
          anon_unknown.dwarf_104bbf5::FileSetType::AddFileSet
                    (&pcVar3->CxxModuleHeadersFileSets,name,uVar1,&local_258);
          cmListFileBacktrace::~cmListFileBacktrace(&local_258);
        }
      }
    }
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1c8);
  }
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>
           ::operator->(&local_48);
  local_260 = &ppVar4->second;
  pVar6 = std::make_pair<cmFileSet*,bool&>(&local_260,(bool *)&result);
  return pVar6;
}

Assistant:

std::pair<cmFileSet*, bool> cmTarget::GetOrCreateFileSet(
  const std::string& name, const std::string& type, cmFileSetVisibility vis)
{
  auto result = this->impl->FileSets.emplace(
    std::make_pair(name, cmFileSet(name, type, vis)));
  if (result.second) {
    auto bt = this->impl->Makefile->GetBacktrace();
    if (type == this->impl->HeadersFileSets.TypeName) {
      this->impl->HeadersFileSets.AddFileSet(name, vis, std::move(bt));
    } else if (type == this->impl->CxxModulesFileSets.TypeName) {
      this->impl->CxxModulesFileSets.AddFileSet(name, vis, std::move(bt));
    } else if (type == this->impl->CxxModuleHeadersFileSets.TypeName) {
      this->impl->CxxModuleHeadersFileSets.AddFileSet(name, vis,
                                                      std::move(bt));
    }
  }
  return std::make_pair(&result.first->second, result.second);
}